

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

int ndiGetIRCHKNumberOfSources(ndicapi *pol,int side)

{
  long lVar1;
  uint uVar2;
  
  if (pol->IrchkSources[0] != '\0') {
    lVar1 = ndiSignedToLong(pol->IrchkSources,3);
    uVar2 = (uint)lVar1;
    if (uVar2 < 0x15) {
      lVar1 = ndiSignedToLong(pol->IrchkSources + (ulong)(uVar2 * 6) + 3,3);
      if ((uint)lVar1 < 0x15) {
        if (side == 0) {
          return uVar2;
        }
        if (side == 1) {
          return (uint)lVar1;
        }
      }
    }
  }
  return 0;
}

Assistant:

ndicapiExport int ndiGetIRCHKNumberOfSources(ndicapi* pol, int side)
{
  const char* dp;
  int n, m;

  dp = pol->IrchkSources;

  if (*dp == '\0')
  {
    return 0;
  }

  n = (int)ndiSignedToLong(dp, 3);
  if (n < 0 || n > 20)
  {
    return 0;
  }
  m = (int)ndiSignedToLong(dp + 3 + 2 * 3 * n, 3);
  if (m < 0 || m > 20)
  {
    return 0;
  }

  if (side == NDI_LEFT)
  {
    return n;
  }
  else if (side == NDI_RIGHT)
  {
    return m;
  }

  return 0;
}